

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

string * __thiscall
google::protobuf::Message::ShortDebugString_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  Printer printer;
  Printer PStack_98;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  TextFormat::Printer::Printer(&PStack_98);
  PStack_98.single_line_mode_ = true;
  PStack_98.expand_any_ = true;
  TextFormat::Printer::PrintToString(&PStack_98,this,__return_storage_ptr__);
  if ((__return_storage_ptr__->_M_string_length != 0) &&
     ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] ==
      ' ')) {
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  }
  TextFormat::Printer::~Printer(&PStack_98);
  return __return_storage_ptr__;
}

Assistant:

std::string Message::ShortDebugString() const {
  std::string debug_string;

  TextFormat::Printer printer;
  printer.SetSingleLineMode(true);
  printer.SetExpandAny(true);

  printer.PrintToString(*this, &debug_string);
  // Single line mode currently might have an extra space at the end.
  if (debug_string.size() > 0 && debug_string[debug_string.size() - 1] == ' ') {
    debug_string.resize(debug_string.size() - 1);
  }

  return debug_string;
}